

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::AddTaprootSchnorrSignTxInRequest::ConvertFromStruct
          (AddTaprootSchnorrSignTxInRequest *this,AddTaprootSchnorrSignTxInRequestStruct *data)

{
  AddTaprootSchnorrSignTxInRequestStruct *data_local;
  AddTaprootSchnorrSignTxInRequest *this_local;
  
  std::__cxx11::string::operator=((string *)&this->txid_,(string *)data);
  this->vout_ = data->vout;
  std::__cxx11::string::operator=((string *)&this->signature_,(string *)&data->signature);
  std::__cxx11::string::operator=((string *)&this->sighash_type_,(string *)&data->sighash_type);
  this->sighash_anyone_can_pay_ = (bool)(data->sighash_anyone_can_pay & 1);
  this->sighash_rangeproof_ = (bool)(data->sighash_rangeproof & 1);
  std::__cxx11::string::operator=((string *)&this->annex_,(string *)&data->annex);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void AddTaprootSchnorrSignTxInRequest::ConvertFromStruct(
    const AddTaprootSchnorrSignTxInRequestStruct& data) {
  txid_ = data.txid;
  vout_ = data.vout;
  signature_ = data.signature;
  sighash_type_ = data.sighash_type;
  sighash_anyone_can_pay_ = data.sighash_anyone_can_pay;
  sighash_rangeproof_ = data.sighash_rangeproof;
  annex_ = data.annex;
  ignore_items = data.ignore_items;
}